

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

string * anon_unknown.dwarf_5b8e::readFileContents(string *__return_storage_ptr__,string *path)

{
  char *__filename;
  FILE *__stream;
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  size_t result;
  size_t pos;
  uint64_t size;
  FILE *fp;
  string *path_local;
  string *str;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb");
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    for (result = 0; result < uVar1; result = sVar3 + result) {
      lVar2 = std::__cxx11::string::data();
      sVar3 = fread((void *)(lVar2 + result),1,uVar1 - result,__stream);
    }
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string readFileContents(std::string path) {
  FILE * fp = fopen(path.c_str(), "rb");
  std::string str;
  if (fp) {
    fseek(fp, 0, SEEK_END);
    uint64_t size = ftell(fp);
    fseek(fp, 0, SEEK_SET);
    str.resize(size);
    size_t pos = 0;
    while (pos < size) {
      size_t result = fread((void *)(str.data() + pos), 1, size - pos, fp);
      pos += result;
    }
    fclose(fp);
  }
  return str;
}